

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_r3411_2012.c
# Opt level: O0

void LPSX(u64 *out,u64 *a,u64 *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  u64 t_7;
  u64 t_6;
  u64 t_5;
  u64 t_4;
  u64 t_3;
  u64 t_2;
  u64 t_1;
  u64 t;
  u64 temp [8];
  u64 *b_local;
  u64 *a_local;
  u64 *out_local;
  
  uVar1 = *a ^ *b;
  uVar2 = a[1] ^ b[1];
  uVar3 = a[2] ^ b[2];
  uVar4 = a[3] ^ b[3];
  uVar5 = a[4] ^ b[4];
  uVar6 = a[5] ^ b[5];
  uVar7 = a[6] ^ b[6];
  uVar8 = a[7] ^ b[7];
  *out = streebog_table[7][uVar8 & 0xff] ^
         streebog_table[6][uVar7 & 0xff] ^
         streebog_table[5][uVar6 & 0xff] ^
         streebog_table[4][uVar5 & 0xff] ^
         streebog_table[3][uVar4 & 0xff] ^
         streebog_table[2][uVar3 & 0xff] ^
         streebog_table[1][uVar2 & 0xff] ^ streebog_table[0][uVar1 & 0xff];
  out[1] = streebog_table[7][uVar8 >> 8 & 0xff] ^
           streebog_table[6][uVar7 >> 8 & 0xff] ^
           streebog_table[5][uVar6 >> 8 & 0xff] ^
           streebog_table[4][uVar5 >> 8 & 0xff] ^
           streebog_table[3][uVar4 >> 8 & 0xff] ^
           streebog_table[2][uVar3 >> 8 & 0xff] ^
           streebog_table[1][uVar2 >> 8 & 0xff] ^ streebog_table[0][uVar1 >> 8 & 0xff];
  out[2] = streebog_table[7][uVar8 >> 0x10 & 0xff] ^
           streebog_table[6][uVar7 >> 0x10 & 0xff] ^
           streebog_table[5][uVar6 >> 0x10 & 0xff] ^
           streebog_table[4][uVar5 >> 0x10 & 0xff] ^
           streebog_table[3][uVar4 >> 0x10 & 0xff] ^
           streebog_table[2][uVar3 >> 0x10 & 0xff] ^
           streebog_table[1][uVar2 >> 0x10 & 0xff] ^ streebog_table[0][uVar1 >> 0x10 & 0xff];
  out[3] = streebog_table[7][uVar8 >> 0x18 & 0xff] ^
           streebog_table[6][uVar7 >> 0x18 & 0xff] ^
           streebog_table[5][uVar6 >> 0x18 & 0xff] ^
           streebog_table[4][uVar5 >> 0x18 & 0xff] ^
           streebog_table[3][uVar4 >> 0x18 & 0xff] ^
           streebog_table[2][uVar3 >> 0x18 & 0xff] ^
           streebog_table[1][uVar2 >> 0x18 & 0xff] ^ streebog_table[0][uVar1 >> 0x18 & 0xff];
  out[4] = streebog_table[7][uVar8 >> 0x20 & 0xff] ^
           streebog_table[6][uVar7 >> 0x20 & 0xff] ^
           streebog_table[5][uVar6 >> 0x20 & 0xff] ^
           streebog_table[4][uVar5 >> 0x20 & 0xff] ^
           streebog_table[3][uVar4 >> 0x20 & 0xff] ^
           streebog_table[2][uVar3 >> 0x20 & 0xff] ^
           streebog_table[1][uVar2 >> 0x20 & 0xff] ^ streebog_table[0][uVar1 >> 0x20 & 0xff];
  out[5] = streebog_table[7][uVar8 >> 0x28 & 0xff] ^
           streebog_table[6][uVar7 >> 0x28 & 0xff] ^
           streebog_table[5][uVar6 >> 0x28 & 0xff] ^
           streebog_table[4][uVar5 >> 0x28 & 0xff] ^
           streebog_table[3][uVar4 >> 0x28 & 0xff] ^
           streebog_table[2][uVar3 >> 0x28 & 0xff] ^
           streebog_table[1][uVar2 >> 0x28 & 0xff] ^ streebog_table[0][uVar1 >> 0x28 & 0xff];
  out[6] = streebog_table[7][uVar8 >> 0x30 & 0xff] ^
           streebog_table[6][uVar7 >> 0x30 & 0xff] ^
           streebog_table[5][uVar6 >> 0x30 & 0xff] ^
           streebog_table[4][uVar5 >> 0x30 & 0xff] ^
           streebog_table[3][uVar4 >> 0x30 & 0xff] ^
           streebog_table[2][uVar3 >> 0x30 & 0xff] ^
           streebog_table[1][uVar2 >> 0x30 & 0xff] ^ streebog_table[0][uVar1 >> 0x30 & 0xff];
  out[7] = streebog_table[7][uVar8 >> 0x38] ^
           streebog_table[6][uVar7 >> 0x38] ^
           streebog_table[5][uVar6 >> 0x38] ^
           streebog_table[4][uVar5 >> 0x38] ^
           streebog_table[3][uVar4 >> 0x38] ^
           streebog_table[2][uVar3 >> 0x38] ^
           streebog_table[1][uVar2 >> 0x38] ^ streebog_table[0][uVar1 >> 0x38];
  return;
}

Assistant:

static inline void LPSX (u64 *out, const u64 *a, const u64 *b)
{
  u64 temp[8];
#ifdef LISSI_DEBUG
  int i;
  printf("LPSX\n");
#endif
  temp[0] = a[0] ^ b[0];
  temp[1] = a[1] ^ b[1];
  temp[2] = a[2] ^ b[2];
  temp[3] = a[3] ^ b[3];
  temp[4] = a[4] ^ b[4];
  temp[5] = a[5] ^ b[5];
  temp[6] = a[6] ^ b[6];
  temp[7] = a[7] ^ b[7];
  strido (out, temp, 0);
  strido (out, temp, 1);
  strido (out, temp, 2);
  strido (out, temp, 3);
  strido (out, temp, 4);
  strido (out, temp, 5);
  strido (out, temp, 6);
  strido (out, temp, 7);
#ifdef LISSI_DEBUG
  for (i=0; i<8; i++){
    printf("0x%llX\n", out[i]);
  }
#endif
}